

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O3

int write_strings(char *sfile)

{
  char cVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  char *pcVar4;
  Fl_Type *pFVar5;
  
  __stream = (FILE *)fl_fopen(sfile,"w");
  if (__stream != (FILE *)0x0) {
    if (i18n_type == 2) {
      fprintf(__stream,"$ generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      fprintf(__stream,"$set %s\n",i18n_set);
      fputs("$quote \"\n",__stream);
      if (Fl_Type::first != (Fl_Type *)0x0) {
        uVar3 = 1;
        pFVar5 = Fl_Type::first;
        do {
          iVar2 = (*pFVar5->_vptr_Fl_Type[0x17])(pFVar5);
          if (iVar2 != 0) {
            if (pFVar5->label_ != (char *)0x0) {
              fprintf(__stream,"%d \"",uVar3);
              pcVar4 = pFVar5->label_;
              cVar1 = *pcVar4;
              while (cVar1 != '\0') {
                pcVar4 = pcVar4 + 1;
                if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                  fprintf(__stream,"\\%03o");
                }
                else {
                  putc((int)cVar1,__stream);
                }
                cVar1 = *pcVar4;
              }
              uVar3 = (ulong)((int)uVar3 + 1);
              fputs("\"\n",__stream);
            }
            if (pFVar5[1].user_data_type_ != (char *)0x0) {
              fprintf(__stream,"%d \"",uVar3);
              pcVar4 = pFVar5[1].user_data_type_;
              cVar1 = *pcVar4;
              while (cVar1 != '\0') {
                pcVar4 = pcVar4 + 1;
                if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                  fprintf(__stream,"\\%03o");
                }
                else {
                  putc((int)cVar1,__stream);
                }
                cVar1 = *pcVar4;
              }
              uVar3 = (ulong)((int)uVar3 + 1);
              fputs("\"\n",__stream);
            }
          }
          pFVar5 = pFVar5->next;
        } while (pFVar5 != (Fl_Type *)0x0);
      }
    }
    else if (i18n_type == 1) {
      fprintf(__stream,"# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      for (pFVar5 = Fl_Type::first; pFVar5 != (Fl_Type *)0x0; pFVar5 = pFVar5->next) {
        iVar2 = (*pFVar5->_vptr_Fl_Type[0x17])(pFVar5);
        if (iVar2 != 0) {
          if (pFVar5->label_ != (char *)0x0) {
            fputs("msgid \"",__stream);
            pcVar4 = pFVar5->label_;
            cVar1 = *pcVar4;
            while (cVar1 != '\0') {
              pcVar4 = pcVar4 + 1;
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
              cVar1 = *pcVar4;
            }
            fputs("\"\n",__stream);
            fputs("msgstr \"",__stream);
            pcVar4 = pFVar5->label_;
            cVar1 = *pcVar4;
            while (cVar1 != '\0') {
              pcVar4 = pcVar4 + 1;
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
              cVar1 = *pcVar4;
            }
            fputs("\"\n",__stream);
          }
          if (pFVar5[1].user_data_type_ != (char *)0x0) {
            fputs("msgid \"",__stream);
            pcVar4 = pFVar5[1].user_data_type_;
            cVar1 = *pcVar4;
            while (cVar1 != '\0') {
              pcVar4 = pcVar4 + 1;
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
              cVar1 = *pcVar4;
            }
            fputs("\"\n",__stream);
            fputs("msgstr \"",__stream);
            pcVar4 = pFVar5[1].user_data_type_;
            cVar1 = *pcVar4;
            while (cVar1 != '\0') {
              pcVar4 = pcVar4 + 1;
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
              cVar1 = *pcVar4;
            }
            fputs("\"\n",__stream);
          }
        }
      }
    }
    else if (i18n_type == 0) {
      fprintf(__stream,"# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      for (pFVar5 = Fl_Type::first; pFVar5 != (Fl_Type *)0x0; pFVar5 = pFVar5->next) {
        iVar2 = (*pFVar5->_vptr_Fl_Type[0x17])(pFVar5);
        if (iVar2 != 0) {
          pcVar4 = pFVar5->label_;
          if (pcVar4 != (char *)0x0) {
            cVar1 = *pcVar4;
            while (cVar1 != '\0') {
              pcVar4 = pcVar4 + 1;
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
              cVar1 = *pcVar4;
            }
            putc(10,__stream);
          }
          pcVar4 = pFVar5[1].user_data_type_;
          if (pcVar4 != (char *)0x0) {
            cVar1 = *pcVar4;
            while (cVar1 != '\0') {
              pcVar4 = pcVar4 + 1;
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
              cVar1 = *pcVar4;
            }
            putc(10,__stream);
          }
        }
      }
    }
    iVar2 = fclose(__stream);
    return iVar2;
  }
  return 1;
}

Assistant:

int write_strings(const char *sfile) {
  FILE *fp = fl_fopen(sfile, "w");
  Fl_Type *p;
  Fl_Widget_Type *w;
  int i;

  if (!fp) return 1;

  switch (i18n_type) {
  case 0 : /* None, just put static text out */
      fprintf(fp, "# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      for (p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    for (const char *s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            putc('\n', fp);
	  }

	  if (w->tooltip()) {
	    for (const char *s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            putc('\n', fp);
	  }
	}
      }
      break;
  case 1 : /* GNU gettext, put a .po file out */
      fprintf(fp, "# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      for (p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    const char *s;

	    fputs("msgid \"", fp);
	    for (s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);

	    fputs("msgstr \"", fp);
	    for (s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }

	  if (w->tooltip()) {
	    const char *s;

	    fputs("msgid \"", fp);
	    for (s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);

	    fputs("msgstr \"", fp);
	    for (s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }
	}
      }
      break;
  case 2 : /* POSIX catgets, put a .msg file out */
      fprintf(fp, "$ generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      fprintf(fp, "$set %s\n", i18n_set);
      fputs("$quote \"\n", fp);

      for (i = 1, p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    fprintf(fp, "%d \"", i ++);
	    for (const char *s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }

	  if (w->tooltip()) {
	    fprintf(fp, "%d \"", i ++);
	    for (const char *s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }
	}
      }
      break;
  }

  return fclose(fp);
}